

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

int __thiscall deci::ast_while_t::Generate(ast_while_t *this,ostream *output,int pc)

{
  pointer ppaVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  pointer ppaVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(output,": __while_",10);
  poVar3 = (ostream *)std::ostream::operator<<(output,pc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar2 = (*this->condition->_vptr_ast_item_t[2])(this->condition,output,(ulong)(uint)pc);
  std::__ostream_insert<char,std::char_traits<char>>(output,"jz __end_while_",0xf);
  poVar3 = (ostream *)std::ostream::operator<<(output,pc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar4 = iVar2 + 1;
  (this->super_ast_loop_t).end_loc_pos = pc;
  ppaVar1 = (this->loop->statements).
            super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar5 = (this->loop->statements).
                 super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar5 != ppaVar1; ppaVar5 = ppaVar5 + 1) {
    uVar4 = (*(*ppaVar5)->_vptr_ast_item_t[2])(*ppaVar5,output,(ulong)uVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"jmp __while_",0xc);
  poVar3 = (ostream *)std::ostream::operator<<(output,pc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,": __end_while_",0xe);
  poVar3 = (ostream *)std::ostream::operator<<(output,pc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return uVar4 + 1;
}

Assistant:

int ast_while_t::Generate(std::ostream& output, int pc) const {

    int while_loc = pc;

    output << ": __while_" << while_loc << "__" << std::endl;
    pc = this->condition->Generate(output, pc);
    output << "jz __end_while_" << while_loc << "__" << std::endl;
    ++pc;

    this->end_loc_pos = while_loc;
    pc = this->loop->Generate(output, pc);
    output << "jmp __while_" << while_loc << "__" << std::endl;
    ++pc;

    output << ": __end_while_" <<while_loc << "__" << std::endl;
    return pc;
  }